

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

uint32_t __thiscall spvtools::val::ValidationState_t::GetTypeId(ValidationState_t *this,uint32_t id)

{
  uint32_t uVar1;
  Instruction *pIVar2;
  
  pIVar2 = FindDef(this,id);
  if (pIVar2 == (Instruction *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (pIVar2->inst_).type_id;
  }
  return uVar1;
}

Assistant:

uint32_t ValidationState_t::GetTypeId(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  return inst ? inst->type_id() : 0;
}